

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O3

void __thiscall
MT32Emu::MidiStreamParserImpl::processShortMessage(MidiStreamParserImpl *this,Bit32u message)

{
  Bit8u status;
  byte bVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  MidiReceiver *pMVar3;
  
  uVar2 = CONCAT44(in_register_00000034,message);
  bVar1 = (byte)message;
  if ((~message & 0xf8) == 0) {
    (*this->midiReceiver->_vptr_MidiReceiver[2])(this->midiReceiver,(ulong)bVar1);
    return;
  }
  if (-1 < (char)bVar1) {
    if (-1 < (char)this->runningStatus) {
      (**this->midiReporter->_vptr_MidiReporter)
                (this->midiReporter,
                 "processStatusByte: No valid running status yet, MIDI message ignored");
      return;
    }
    pMVar3 = this->midiReceiver;
    uVar2 = (ulong)(message << 8 | (uint)this->runningStatus);
    goto LAB_0011190f;
  }
  if (bVar1 < 0xf0) {
LAB_00111908:
    this->runningStatus = (Bit8u)message;
  }
  else if (bVar1 < 0xf8) {
    message = 0;
    goto LAB_00111908;
  }
  pMVar3 = this->midiReceiver;
LAB_0011190f:
  (**pMVar3->_vptr_MidiReceiver)(pMVar3,uVar2);
  return;
}

Assistant:

void MidiStreamParserImpl::processShortMessage(const Bit32u message) {
	// Adds running status to the MIDI message if it doesn't contain one
	Bit8u status = Bit8u(message & 0xFF);
	if (0xF8 <= status) {
		midiReceiver.handleSystemRealtimeMessage(status);
	} else if (processStatusByte(status)) {
		midiReceiver.handleShortMessage((message << 8) | status);
	} else if (0x80 <= status) { // If no running status available yet, skip this message
		midiReceiver.handleShortMessage(message);
	}
}